

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_string.h
# Opt level: O0

int opj_strcpy_s(char *dst,size_t dst_size,char *src)

{
  size_t __n;
  size_t src_len;
  char *src_local;
  size_t dst_size_local;
  char *dst_local;
  
  if ((dst == (char *)0x0) || (dst_size == 0)) {
    dst_local._4_4_ = 0x16;
  }
  else if (src == (char *)0x0) {
    *dst = '\0';
    dst_local._4_4_ = 0x16;
  }
  else {
    __n = opj_strnlen_s(src,dst_size);
    if (__n < dst_size) {
      memcpy(dst,src,__n);
      dst[__n] = '\0';
      dst_local._4_4_ = 0;
    }
    else {
      dst_local._4_4_ = 0x22;
    }
  }
  return dst_local._4_4_;
}

Assistant:

static int opj_strcpy_s(char* dst, size_t dst_size, const char* src)
{
    size_t src_len = 0U;
    if ((dst == NULL) || (dst_size == 0U)) {
        return EINVAL;
    }
    if (src == NULL) {
        dst[0] = '\0';
        return EINVAL;
    }
    src_len = opj_strnlen_s(src, dst_size);
    if (src_len >= dst_size) {
        return ERANGE;
    }
    memcpy(dst, src, src_len);
    dst[src_len] = '\0';
    return 0;
}